

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  ostream *poVar5;
  ostream *poVar6;
  long in_RSI;
  long in_RDI;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  undefined8 in_stack_fffffffffffffe18;
  Code _colourCode;
  Colour *in_stack_fffffffffffffe20;
  Colour *this_00;
  allocator<char> *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  char cVar7;
  size_type in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_101;
  string local_100 [38];
  Colour local_da;
  allocator<char> local_d9;
  string local_d8 [38];
  undefined1 local_b2 [2];
  string local_b0 [38];
  Colour local_8a;
  allocator<char> local_89;
  string local_88 [35];
  Colour local_65 [20];
  allocator<char> local_51;
  string local_50 [39];
  Colour local_29;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  sVar2 = Counts::total((Counts *)(in_RSI + 0x20));
  if (sVar2 == 0) {
    poVar5 = *(ostream **)(in_RDI + 0x18);
    this_00 = &local_da;
    Colour::Colour(this_00,(Code)((ulong)poVar5 >> 0x20));
    poVar5 = Catch::operator<<(poVar5,this_00);
    cVar7 = (char)((ulong)&local_101 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,cVar7,(allocator<char> *)poVar5);
    std::operator<<((ostream *)poVar5,local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    Colour::~Colour((Colour *)0x14337c);
  }
  else {
    sVar2 = *(size_t *)(local_10 + 0x28);
    sVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_18 = anon_unknown_1::makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(local_10 + 0x30);
    sVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_20 = anon_unknown_1::makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(local_10 + 0x20);
    sVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_28 = anon_unknown_1::makeRatio(sVar2,sVar3);
    while (local_18 + local_20 + local_28 < 0x4f) {
      psVar4 = anon_unknown_1::findMax(&local_18,&local_20,&local_28);
      *psVar4 = *psVar4 + 1;
    }
    while( true ) {
      cVar7 = (char)((ulong)in_stack_fffffffffffffe30 >> 0x38);
      _colourCode = (Code)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      if (local_18 + local_20 + local_28 < 0x50) break;
      psVar4 = anon_unknown_1::findMax(&local_18,&local_20,&local_28);
      *psVar4 = *psVar4 - 1;
    }
    poVar5 = *(ostream **)(in_RDI + 0x18);
    Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
    poVar5 = Catch::operator<<(poVar5,&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,cVar7,in_stack_fffffffffffffe28);
    std::operator<<((ostream *)poVar5,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    Colour::~Colour((Colour *)0x142f2b);
    poVar5 = *(ostream **)(in_RDI + 0x18);
    Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
    poVar5 = Catch::operator<<(poVar5,local_65);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,cVar7,in_stack_fffffffffffffe28);
    std::operator<<((ostream *)poVar5,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    Colour::~Colour((Colour *)0x142ff1);
    bVar1 = Counts::allPassed((Counts *)(local_10 + 0x20));
    if (bVar1) {
      poVar5 = *(ostream **)(in_RDI + 0x18);
      Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
      poVar5 = Catch::operator<<(poVar5,&local_8a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,cVar7,in_stack_fffffffffffffe28
                );
      std::operator<<((ostream *)poVar5,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(local_b2 + 1));
      Colour::~Colour((Colour *)0x1430bf);
    }
    else {
      poVar5 = *(ostream **)(in_RDI + 0x18);
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b2;
      Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
      poVar6 = Catch::operator<<(poVar5,(Colour *)this_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(size_type)poVar5,cVar7,in_stack_fffffffffffffe28);
      std::operator<<((ostream *)poVar6,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      Colour::~Colour((Colour *)0x14327a);
    }
  }
  std::operator<<(*(ostream **)(in_RDI + 0x18),'\n');
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)--;

        stream << Colour(Colour::Error) << std::string(failedRatio, '=');
        stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
        if (totals.testCases.allPassed())
            stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
        else
            stream << Colour(Colour::Success) << std::string(passedRatio, '=');
    } else {
        stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
    }
    stream << '\n';
}